

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflectance.cpp
# Opt level: O0

Spectrum * __thiscall
phyr::MicrofacetReflection::f(MicrofacetReflection *this,Vector3f *wo,Vector3f *wi)

{
  Vector3<double> *in_RCX;
  undefined8 in_RDX;
  CoefficientSpectrum<60> *in_RSI;
  Vector3<double> *in_RDI;
  Spectrum F;
  Vector3f wh;
  double cosThetaI;
  double cosThetaO;
  Vector3<double> *in_stack_fffffffffffff618;
  Vector3<double> *in_stack_fffffffffffff620;
  SampledSpectrum *this_00;
  Vector3<double> *c1;
  undefined1 local_238 [480];
  double local_58;
  double local_50;
  double local_48;
  Vector3<double> local_40;
  double local_28;
  double local_20;
  Vector3<double> *local_18;
  undefined8 local_10;
  
  c1 = in_RDI;
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_20 = absCosTheta((Vector3f *)0x1ad303);
  local_28 = absCosTheta((Vector3f *)0x1ad319);
  Vector3<double>::operator+(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  if (((local_28 == 0.0) && (!NAN(local_28))) || ((local_20 == 0.0 && (!NAN(local_20))))) {
    SampledSpectrum::SampledSpectrum
              ((SampledSpectrum *)in_stack_fffffffffffff620,(double)in_stack_fffffffffffff618);
  }
  else if (((((local_40.x != 0.0) || (NAN(local_40.x))) || (local_40.y != 0.0)) ||
           ((NAN(local_40.y) || (local_40.z != 0.0)))) || (NAN(local_40.z))) {
    normalize<double>(in_RDI);
    local_40.x = local_58;
    local_40.y = local_50;
    local_40.z = local_48;
    this_00 = (SampledSpectrum *)in_RSI[1].samples[3];
    dot<double>(local_18,&local_40);
    (**(code **)(this_00->super_CoefficientSpectrum<60>).samples[0])(local_238);
    (**(code **)(*(long *)in_RSI[1].samples[2] + 0x10))((long *)in_RSI[1].samples[2],&local_40);
    CoefficientSpectrum<60>::operator*(in_RSI,(double)c1);
    (**(code **)(*(long *)in_RSI[1].samples[2] + 0x20))
              ((long *)in_RSI[1].samples[2],local_10,local_18);
    CoefficientSpectrum<60>::operator*(in_RSI,(double)c1);
    CoefficientSpectrum<60>::operator*(in_RSI,(CoefficientSpectrum<60> *)c1);
    CoefficientSpectrum<60>::operator/(in_RSI,(double)c1);
    SampledSpectrum::SampledSpectrum(this_00,(CoefficientSpectrum<60> *)in_stack_fffffffffffff618);
  }
  else {
    SampledSpectrum::SampledSpectrum
              ((SampledSpectrum *)in_stack_fffffffffffff620,(double)in_stack_fffffffffffff618);
  }
  return (Spectrum *)c1;
}

Assistant:

Spectrum MicrofacetReflection::f(const Vector3f& wo, const Vector3f& wi) const {
    Real cosThetaO = absCosTheta(wo), cosThetaI = absCosTheta(wi);
    Vector3f wh = wi + wo;

    // Handle degenerate cases for microfacet reflection
    if (cosThetaI == 0 || cosThetaO == 0) return Spectrum(0.);
    if (wh.x == 0 && wh.y == 0 && wh.z == 0) return Spectrum(0.);
    wh = normalize(wh);
    Spectrum F = fresnel->evaluate(dot(wi, wh));

    return R * distribution->d(wh) * distribution->g(wo, wi) * F / (4 * cosThetaI * cosThetaO);
}